

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_store(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *code;
  store_conflict *v;
  store_conflict *s;
  wchar_t feat;
  parser *p_local;
  
  code = parser_getstr(p,"feat");
  wVar2 = lookup_feat_code(code);
  if ((wVar2 < L'\0') ||
     (_Var1 = flag_has_dbg(f_info[wVar2].flags,4,0x15,"f_info[feat].flags","TF_SHOP"), !_Var1)) {
    return PARSE_ERROR_INVALID_VALUE;
  }
  if ((f_info[wVar2].shopnum != '\0') && ((ushort)f_info[wVar2].shopnum <= z_info->store_max)) {
    v = stores + (int)(f_info[wVar2].shopnum - 1);
    v->feat = wVar2;
    v->stock_size = z_info->store_inven_max;
    parser_setpriv(p,v);
    return PARSE_ERROR_NONE;
  }
  __assert_fail("f_info[feat].shopnum >= 1 && f_info[feat].shopnum <= z_info->store_max",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/store.c"
                ,0x8d,"enum parser_error parse_store(struct parser *)");
}

Assistant:

static enum parser_error parse_store(struct parser *p) {
	int feat = lookup_feat_code(parser_getstr(p, "feat"));
	struct store *s;

	if (feat < 0 || !tf_has(f_info[feat].flags, TF_SHOP)) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	assert(f_info[feat].shopnum >= 1
		&& f_info[feat].shopnum <= z_info->store_max);
	s = &stores[f_info[feat].shopnum - 1];
	s->feat = feat;
	s->stock_size = z_info->store_inven_max;
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}